

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O0

int destroy_arm(obj *atmp,boolean already_dead)

{
  obj *poVar1;
  boolean bVar2;
  char *pcVar3;
  char *pcVar4;
  obj *otmp;
  boolean already_dead_local;
  obj *atmp_local;
  
  poVar1 = uarmc;
  if ((uarmc == (obj *)0x0) ||
     (((atmp != (obj *)0x0 && (atmp != uarmc)) || (bVar2 = obj_resists(uarmc,0,0x5a), bVar2 != '\0')
      ))) {
    poVar1 = uarm;
    if ((uarm == (obj *)0x0) ||
       (((atmp != (obj *)0x0 && (atmp != uarm)) || (bVar2 = obj_resists(uarm,0,0x5a), bVar2 != '\0')
        ))) {
      poVar1 = uarmu;
      if (((uarmu == (obj *)0x0) || ((atmp != (obj *)0x0 && (atmp != uarmu)))) ||
         (bVar2 = obj_resists(uarmu,0,0x5a), bVar2 != '\0')) {
        poVar1 = uarmh;
        if ((uarmh == (obj *)0x0) ||
           (((atmp != (obj *)0x0 && (atmp != uarmh)) ||
            (bVar2 = obj_resists(uarmh,0,0x5a), bVar2 != '\0')))) {
          poVar1 = uarmg;
          if ((uarmg == (obj *)0x0) ||
             (((atmp != (obj *)0x0 && (atmp != uarmg)) ||
              (bVar2 = obj_resists(uarmg,0,0x5a), bVar2 != '\0')))) {
            poVar1 = uarmf;
            if (((uarmf == (obj *)0x0) || ((atmp != (obj *)0x0 && (atmp != uarmf)))) ||
               (bVar2 = obj_resists(uarmf,0,0x5a), bVar2 != '\0')) {
              poVar1 = uarms;
              if ((uarms == (obj *)0x0) ||
                 (((atmp != (obj *)0x0 && (atmp != uarms)) ||
                  (bVar2 = obj_resists(uarms,0,0x5a), bVar2 != '\0')))) {
                return 0;
              }
              bVar2 = donning(poVar1);
              if (bVar2 != '\0') {
                cancel_don();
              }
              pline("Your shield crumbles away!");
              Shield_off();
              useup(poVar1);
            }
            else {
              bVar2 = donning(poVar1);
              if (bVar2 != '\0') {
                cancel_don();
              }
              pline("Your boots disintegrate!");
              Boots_off();
              useup(poVar1);
            }
          }
          else {
            bVar2 = donning(poVar1);
            if (bVar2 != '\0') {
              cancel_don();
            }
            pline("Your gloves vanish!");
            Gloves_off();
            useup(poVar1);
            selftouch("You");
          }
        }
        else {
          bVar2 = donning(poVar1);
          if (bVar2 != '\0') {
            cancel_don();
          }
          pline("Your helmet turns to dust and is blown away!");
          Helmet_off();
          useup(poVar1);
        }
      }
      else {
        bVar2 = donning(poVar1);
        if (bVar2 != '\0') {
          cancel_don();
        }
        pline("Your shirt crumbles into tiny threads and falls apart!");
        Shirt_off();
        useup(poVar1);
      }
    }
    else {
      bVar2 = donning(poVar1);
      if (bVar2 != '\0') {
        cancel_don();
      }
      pcVar3 = Ysimple_name2(poVar1);
      pcVar4 = surface((int)u.ux,(int)u.uy);
      pline("%s turns to dust and falls to the %s!",pcVar3,pcVar4);
      Armor_gone(already_dead);
      useup(poVar1);
    }
  }
  else {
    bVar2 = donning(poVar1);
    if (bVar2 != '\0') {
      cancel_don();
    }
    pcVar3 = cloak_simple_name(uarmc);
    pline("Your %s crumbles and turns to dust!",pcVar3);
    Cloak_off();
    useup(poVar1);
  }
  stop_occupation();
  return 1;
}

Assistant:

int destroy_arm(struct obj *atmp, boolean already_dead)
{
	struct obj *otmp;
#define DESTROY_ARM(o) ((otmp = (o)) != 0 && \
			(!atmp || atmp == otmp) && \
			(!obj_resists(otmp, 0, 90)))

	if (DESTROY_ARM(uarmc)) {
		if (donning(otmp)) cancel_don();
		pline("Your %s crumbles and turns to dust!",
		     cloak_simple_name(uarmc));
		Cloak_off();
		useup(otmp);
	} else if (DESTROY_ARM(uarm)) {
		if (donning(otmp)) cancel_don();
		pline("%s turns to dust and falls to the %s!",
		      Ysimple_name2(otmp), surface(u.ux,u.uy));
		Armor_gone(already_dead);
		useup(otmp);
	} else if (DESTROY_ARM(uarmu)) {
		if (donning(otmp)) cancel_don();
		pline("Your shirt crumbles into tiny threads and falls apart!");
		Shirt_off();
		useup(otmp);
	} else if (DESTROY_ARM(uarmh)) {
		if (donning(otmp)) cancel_don();
		pline("Your helmet turns to dust and is blown away!");
		Helmet_off();
		useup(otmp);
	} else if (DESTROY_ARM(uarmg)) {
		if (donning(otmp)) cancel_don();
		pline("Your gloves vanish!");
		Gloves_off();
		useup(otmp);
		selftouch("You");
	} else if (DESTROY_ARM(uarmf)) {
		if (donning(otmp)) cancel_don();
		pline("Your boots disintegrate!");
		Boots_off();
		useup(otmp);
	} else if (DESTROY_ARM(uarms)) {
		if (donning(otmp)) cancel_don();
		pline("Your shield crumbles away!");
		Shield_off();
		useup(otmp);
	} else {
		return 0;		/* could not destroy anything */
	}

#undef DESTROY_ARM
	stop_occupation();
	return 1;
}